

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O1

AMQP_MESSENGER_DISPOSITION_RESULT
on_amqp_message_received_callback
          (MESSAGE_HANDLE message,AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO *disposition_info,
          void *context)

{
  int iVar1;
  int iVar2;
  AMQP_TYPE AVar3;
  LOGGER_LOG p_Var4;
  LIST_ITEM_HANDLE item_handle;
  undefined4 *__ptr;
  code *pcVar5;
  undefined8 uVar6;
  uint uVar7;
  AMQP_MESSENGER_DISPOSITION_RESULT AVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  char *pcVar12;
  AMQP_VALUE *unaff_R12;
  bool bVar13;
  uint local_7c;
  char *correlation_id;
  int status_code;
  AMQP_VALUE amqp_map_value;
  BINARY_DATA twin_report;
  uint32_t pair_count;
  char *map_key_name;
  AMQP_VALUE amqp_value;
  int64_t version;
  
  if (message == (MESSAGE_HANDLE)0x0 || context == (void *)0x0) {
    p_Var4 = xlogging_get_log_function();
    AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
    }
    pcVar12 = "Invalid argument (message=%p, context=%p)";
    iVar1 = 0x544;
    goto LAB_0013986d;
  }
  amqp_messenger_destroy_disposition_info(disposition_info);
  iVar1 = message_get_properties(message,(PROPERTIES_HANDLE *)&twin_report);
  if (iVar1 == 0) {
    if (twin_report.bytes == (uchar *)0x0) {
      correlation_id = (char *)0x0;
    }
    else {
      iVar1 = properties_get_correlation_id((PROPERTIES_HANDLE)twin_report.bytes,&amqp_value);
      if (amqp_value != (AMQP_VALUE)0x0 && iVar1 == 0) {
        iVar1 = amqpvalue_get_string(amqp_value,(char **)&amqp_map_value);
        if (iVar1 == 0) {
          iVar1 = mallocAndStrcpy_s(&correlation_id,(char *)amqp_map_value);
          if (iVar1 == 0) goto LAB_001395f0;
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            pcVar12 = "Failed cloning correlation-id";
            iVar1 = 0xfa;
            goto LAB_00139747;
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            pcVar12 = "Failed retrieving string from AMQP value";
            iVar1 = 0xf5;
LAB_00139747:
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"get_message_correlation_id",iVar1,1,pcVar12);
          }
        }
        properties_destroy((PROPERTIES_HANDLE)twin_report.bytes);
        goto LAB_0013975c;
      }
      correlation_id = (char *)0x0;
LAB_001395f0:
      properties_destroy((PROPERTIES_HANDLE)twin_report.bytes);
    }
    iVar1 = message_get_message_annotations(message,&amqp_value);
    if (iVar1 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) {
        local_7c = 0;
      }
      else {
        local_7c = (*p_Var4)(AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                             ,"parse_incoming_twin_message",0x1fa,1,
                             "Failed getting TWIN message annotations");
      }
      bVar13 = false;
      goto LAB_0013a01b;
    }
    if (amqp_value == (AMQP_VALUE)0x0) {
      bVar13 = true;
      local_7c = 0;
    }
    else {
      iVar1 = amqpvalue_get_map_pair_count(amqp_value,&pair_count);
      if (iVar1 == 0) {
        if (pair_count == 0) {
          bVar13 = true;
          local_7c = 0;
        }
        else {
          unaff_R12 = &amqp_map_value;
          local_7c = 0;
          iVar1 = 0;
          uVar9 = 0;
          do {
            iVar2 = amqpvalue_get_map_key_value_pair
                              (amqp_value,(uint32_t)uVar9,(AMQP_VALUE *)&twin_report,unaff_R12);
            if (iVar2 == 0) {
              iVar2 = amqpvalue_get_symbol((AMQP_VALUE)twin_report.bytes,&map_key_name);
              if (iVar2 == 0) {
                pcVar12 = (char *)CONCAT44(map_key_name._4_4_,(uint)map_key_name);
                iVar2 = strcmp("status",pcVar12);
                if (iVar2 == 0) {
                  AVar3 = amqpvalue_get_type(amqp_map_value);
                  if (AVar3 == AMQP_TYPE_INT) {
                    iVar2 = amqpvalue_get_int(amqp_map_value,&status_code);
                    if (iVar2 == 0) {
                      local_7c = 1;
                      goto LAB_00139aaf;
                    }
                    p_Var4 = xlogging_get_log_function();
                    iVar1 = 0x236;
                    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00139c1b;
                    iVar2 = 0x235;
                    pcVar12 = "Failed getting TWIN message status code value";
                  }
                  else {
                    p_Var4 = xlogging_get_log_function();
                    iVar1 = 0x230;
                    if (p_Var4 == (LOGGER_LOG)0x0) {
LAB_00139c1b:
                      bVar13 = false;
                      goto LAB_00139c1e;
                    }
                    iVar2 = 0x22f;
                    pcVar12 = "TWIN message status property expected to be INT";
                  }
                }
                else {
                  iVar2 = strcmp("version",pcVar12);
                  if (iVar2 != 0) {
LAB_00139aaf:
                    amqpvalue_destroy(amqp_map_value);
                    amqpvalue_destroy((AMQP_VALUE)twin_report.bytes);
                    bVar13 = true;
                    goto LAB_00139c1e;
                  }
                  AVar3 = amqpvalue_get_type(amqp_map_value);
                  if (AVar3 == AMQP_TYPE_LONG) {
                    iVar2 = amqpvalue_get_long(amqp_map_value,&version);
                    if (iVar2 == 0) goto LAB_00139aaf;
                    p_Var4 = xlogging_get_log_function();
                    iVar1 = 0x249;
                    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00139c1b;
                    iVar2 = 0x248;
                    pcVar12 = "Failed getting TWIN message version value";
                  }
                  else {
                    p_Var4 = xlogging_get_log_function();
                    iVar1 = 0x243;
                    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00139c1b;
                    iVar2 = 0x242;
                    pcVar12 = "TWIN message version property expected to be LONG";
                  }
                }
              }
              else {
                p_Var4 = xlogging_get_log_function();
                iVar1 = 0x226;
                if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00139c1b;
                iVar2 = 0x225;
                pcVar12 = "Failed getting AMQP value symbol";
              }
              bVar13 = false;
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"parse_incoming_twin_message",iVar2,1,pcVar12);
            }
            else {
              p_Var4 = xlogging_get_log_function();
              iVar1 = 0x21d;
              bVar13 = true;
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"parse_incoming_twin_message",0x21c,1,
                          "Failed getting AMQP map key/value pair (%d)",uVar9);
              }
            }
LAB_00139c1e:
          } while ((bVar13) &&
                  (uVar7 = (uint32_t)uVar9 + 1, uVar9 = (ulong)uVar7, uVar7 < pair_count));
          bVar13 = iVar1 == 0;
        }
      }
      else {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) {
          local_7c = 0;
        }
        else {
          local_7c = (*p_Var4)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                               ,"parse_incoming_twin_message",0x20b,1,
                               "Failed getting TWIN message annotations count");
        }
        bVar13 = false;
      }
      amqpvalue_destroy(amqp_value);
    }
    if (bVar13) {
      iVar1 = message_get_body_type(message,(MESSAGE_BODY_TYPE *)&map_key_name);
      if (iVar1 == 0) {
        if ((uint)map_key_name == 1) {
          bVar13 = true;
          unaff_R12 = (AMQP_VALUE *)0x0;
        }
        else if ((uint)map_key_name == 2) {
          iVar1 = message_get_body_amqp_data_count(message,(size_t *)&amqp_map_value);
          if (iVar1 == 0) {
            if (amqp_map_value == (AMQP_VALUE)0x1) {
              iVar1 = message_get_body_amqp_data_in_place(message,0,&twin_report);
              if (iVar1 == 0) {
                bVar13 = true;
              }
              else {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  pcVar12 = "Failed getting TWIN message body";
                  iVar1 = 0x276;
                  goto LAB_00139fba;
                }
LAB_0013a23b:
                bVar13 = false;
              }
            }
            else {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013a23b;
              bVar13 = false;
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"parse_incoming_twin_message",0x271,1,
                        "Unexpected number of TWIN message bodies (%lu)",amqp_map_value);
            }
          }
          else {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013a23b;
            pcVar12 = "Failed getting TWIN message body count";
            iVar1 = 0x26c;
LAB_00139fba:
            bVar13 = false;
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"parse_incoming_twin_message",iVar1,1,pcVar12);
          }
          unaff_R12 = (AMQP_VALUE *)0x1;
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013a019;
          bVar13 = false;
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"parse_incoming_twin_message",0x280,1,"Unexpected TWIN message body %d",
                    (ulong)(uint)map_key_name);
        }
      }
      else {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013a019;
        bVar13 = false;
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"parse_incoming_twin_message",0x263,1,"Failed getting TWIN message body type");
      }
    }
    else {
LAB_0013a019:
      bVar13 = false;
    }
LAB_0013a01b:
    if (!bVar13) {
      free(correlation_id);
      correlation_id = (char *)0x0;
    }
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"get_message_correlation_id",0xe0,1,"Failed getting AMQP message properties");
    }
LAB_0013975c:
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      local_7c = 0;
    }
    else {
      local_7c = (*p_Var4)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                           ,"parse_incoming_twin_message",0x1f1,1,
                           "Failed retrieving correlation ID from received TWIN message.");
    }
    bVar13 = false;
  }
  if (bVar13) {
    if (correlation_id != (char *)0x0) {
      item_handle = singlylinkedlist_find
                              (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x38),
                               find_twin_operation_by_correlation_id,correlation_id);
      if (item_handle == (LIST_ITEM_HANDLE)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) {
          AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
        }
        else {
          AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"on_amqp_message_received_callback",0x566,1,
                    "Could not find context of TWIN incoming message (%s, %s)",
                    *(undefined8 *)((long)context + 0x10),correlation_id);
        }
        goto LAB_0013a191;
      }
      __ptr = (undefined4 *)singlylinkedlist_item_get_value(item_handle);
      if (__ptr == (undefined4 *)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) {
          AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
        }
        else {
          AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"on_amqp_message_received_callback",0x56e,1,
                    "Could not get context for incoming TWIN message (%s, %s)",
                    *(undefined8 *)((long)context + 0x10),correlation_id);
        }
      }
      else {
        AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
        switch(*__ptr) {
        case 1:
          if ((local_7c & 1) == 0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"on_amqp_message_received_callback",0x576,1,
                        "Received an incoming TWIN message for a PATCH operation, but with no status code (%s, %s)"
                        ,*(undefined8 *)((long)context + 0x10),correlation_id);
            }
            pcVar5 = *(code **)(__ptr + 6);
            AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
            if (pcVar5 != (code *)0x0) {
              uVar6 = *(undefined8 *)(__ptr + 8);
              uVar11 = 1;
              uVar10 = 4;
              status_code = 0;
              goto LAB_00139e7d;
            }
          }
          else {
            pcVar5 = *(code **)(__ptr + 6);
            if (pcVar5 != (code *)0x0) {
              uVar6 = *(undefined8 *)(__ptr + 8);
              uVar11 = 0;
              uVar10 = 0;
LAB_00139e7d:
              (*pcVar5)(uVar11,uVar10,status_code,uVar6);
            }
          }
          break;
        case 2:
          if (((ulong)unaff_R12 & 1) == 0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"on_amqp_message_received_callback",0x58b,1,
                        "Received an incoming TWIN message for a GET operation, but with no report (%s, %s)"
                        ,*(undefined8 *)((long)context + 0x10),correlation_id);
            }
            pcVar5 = *(code **)(*(long *)(__ptr + 2) + 0x60);
            if (pcVar5 != (code *)0x0) {
              (*pcVar5)(1,0,0,*(undefined8 *)(*(long *)(__ptr + 2) + 0x68));
            }
            AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
            if (*(int *)((long)context + 0x50) == 3) {
              *(undefined4 *)((long)context + 0x50) = 2;
LAB_0013a10a:
              *(long *)((long)context + 0x58) = *(long *)((long)context + 0x58) + 1;
            }
          }
          else {
            pcVar5 = *(code **)(*(long *)(__ptr + 2) + 0x60);
            if (pcVar5 != (code *)0x0) {
              (*pcVar5)(1,twin_report.bytes,twin_report.length,
                        *(undefined8 *)(*(long *)(__ptr + 2) + 0x68));
            }
            if (*(int *)((long)context + 0x50) == 3) {
              *(undefined4 *)((long)context + 0x50) = 4;
LAB_0013a0f0:
              *(undefined8 *)((long)context + 0x58) = 0;
            }
          }
          break;
        case 3:
          if (((ulong)unaff_R12 & 1) == 0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"on_amqp_message_received_callback",0x5ac,1,
                        "Received an incoming TWIN message for a GET operation, but with no report (%s, %s)"
                        ,*(undefined8 *)((long)context + 0x10),correlation_id);
            }
            (**(code **)(__ptr + 6))(1,0,0,*(undefined8 *)(__ptr + 8));
            AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
          }
          else {
            (**(code **)(__ptr + 6))
                      (1,twin_report.bytes,twin_report.length,*(undefined8 *)(__ptr + 8));
          }
          break;
        case 4:
          if (*(int *)((long)context + 0x50) == 6) {
            if ((local_7c & 1) == 0) {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 == (LOGGER_LOG)0x0) {
LAB_0013a0db:
                bVar13 = false;
              }
              else {
                bVar13 = false;
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"on_amqp_message_received_callback",0x5bf,1,
                          "Received an incoming TWIN message for a PUT operation, but with no status code (%s, %s)"
                          ,*(undefined8 *)((long)context + 0x10),correlation_id);
              }
            }
            else {
              bVar13 = true;
              if (status_code - 300U < 0xffffff9c) {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013a0db;
                bVar13 = false;
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"on_amqp_message_received_callback",0x5c5,1,
                          "Received status code %d for TWIN subscription request (%s, %s)",
                          (ulong)(uint)status_code,*(undefined8 *)((long)context + 0x10),
                          correlation_id);
              }
            }
            if (*(int *)((long)context + 0x50) == 5) {
              if (!bVar13) {
                *(undefined4 *)((long)context + 0x50) = 4;
                goto LAB_0013a10a;
              }
              *(undefined4 *)((long)context + 0x50) = 6;
              goto LAB_0013a0f0;
            }
          }
          break;
        case 5:
          if (*(int *)((long)context + 0x50) == 1) {
            if ((local_7c & 1) == 0) {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 == (LOGGER_LOG)0x0) {
LAB_0013a0c4:
                bVar13 = false;
              }
              else {
                bVar13 = false;
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"on_amqp_message_received_callback",0x5e1,1,
                          "Received an incoming TWIN message for a DELETE operation, but with no status code (%s, %s)"
                          ,*(undefined8 *)((long)context + 0x10),correlation_id);
              }
            }
            else {
              bVar13 = true;
              if (status_code - 300U < 0xffffff9c) {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013a0c4;
                bVar13 = false;
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"on_amqp_message_received_callback",0x5e7,1,
                          "Received status code %d for TWIN unsubscription request (%s, %s)",
                          (ulong)(uint)status_code,*(undefined8 *)((long)context + 0x10),
                          correlation_id);
              }
            }
            if (*(int *)((long)context + 0x50) == 8) {
              if (!bVar13) {
                *(undefined4 *)((long)context + 0x50) = 7;
                goto LAB_0013a10a;
              }
              *(undefined4 *)((long)context + 0x50) = 1;
              goto LAB_0013a0f0;
            }
          }
        }
        free(*(void **)(__ptr + 4));
        free(__ptr);
      }
      iVar1 = singlylinkedlist_remove
                        (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x38),item_handle);
      if (iVar1 != 0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"on_amqp_message_received_callback",0x602,1,
                    "Failed removing context for incoming TWIN message (%s, %s)",
                    *(undefined8 *)((long)context + 0x10),correlation_id);
        }
        iVar1 = *(int *)((long)context + 0x28);
        if (iVar1 != 4) {
          *(undefined4 *)((long)context + 0x28) = 4;
          if (*(code **)((long)context + 0x40) != (code *)0x0) {
            (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48),iVar1,4);
          }
        }
      }
LAB_0013a191:
      free(correlation_id);
      return AVar8;
    }
    if (((ulong)unaff_R12 & 1) != 0) {
      if (*(code **)((long)context + 0x60) != (code *)0x0) {
        (**(code **)((long)context + 0x60))
                  (0,twin_report.bytes,twin_report.length,*(undefined8 *)((long)context + 0x68));
        return AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
      }
      return AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
    }
    pcVar12 = "Received TWIN message with no correlation-id and no report (%s)";
    iVar1 = 0x615;
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
    }
    pcVar12 = "Failed parsing incoming TWIN message (%s)";
    iVar1 = 0x55b;
  }
  AVar8 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
  message = *(MESSAGE_HANDLE *)((long)context + 0x10);
LAB_0013986d:
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
            ,"on_amqp_message_received_callback",iVar1,1,pcVar12,message);
  return AVar8;
}

Assistant:

static AMQP_MESSENGER_DISPOSITION_RESULT on_amqp_message_received_callback(MESSAGE_HANDLE message, AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO* disposition_info, void* context)
{

    AMQP_MESSENGER_DISPOSITION_RESULT disposition_result;

    if (message == NULL || context == NULL)
    {
        LogError("Invalid argument (message=%p, context=%p)", message, context);
        disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
    }
    else
    {
        TWIN_MESSENGER_INSTANCE* twin_msgr = (TWIN_MESSENGER_INSTANCE*)context;

        char* correlation_id;

        bool has_status_code;
        int status_code;

        bool has_version;
        int64_t version;

        bool has_twin_report;
        BINARY_DATA twin_report;

        amqp_messenger_destroy_disposition_info(disposition_info);
        disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;

        if (parse_incoming_twin_message(message, &correlation_id, &has_version, &version, &has_status_code, &status_code, &has_twin_report, &twin_report) != 0)
        {
            LogError("Failed parsing incoming TWIN message (%s)", twin_msgr->device_id);
        }
        else
        {
            if (correlation_id != NULL)
            {
                // It is supposed to be a request sent previously (reported properties PATCH, GET, PUT or DELETE).

                LIST_ITEM_HANDLE list_item;
                if ((list_item = singlylinkedlist_find(twin_msgr->operations, find_twin_operation_by_correlation_id, (const void*)correlation_id)) == NULL)
                {
                    LogError("Could not find context of TWIN incoming message (%s, %s)", twin_msgr->device_id, correlation_id);
                }
                else
                {
                    TWIN_OPERATION_CONTEXT* twin_op_ctx;

                    if ((twin_op_ctx = (TWIN_OPERATION_CONTEXT*)singlylinkedlist_item_get_value(list_item)) == NULL)
                    {
                        LogError("Could not get context for incoming TWIN message (%s, %s)", twin_msgr->device_id, correlation_id);
                    }
                    else
                    {
                        if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PATCH)
                        {
                            if (!has_status_code)
                            {
                                LogError("Received an incoming TWIN message for a PATCH operation, but with no status code (%s, %s)", twin_msgr->device_id, correlation_id);

                                disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;

                                if (twin_op_ctx->cb.reported_properties.callback != NULL)
                                {
                                    twin_op_ctx->cb.reported_properties.callback(TWIN_REPORT_STATE_RESULT_ERROR, TWIN_REPORT_STATE_REASON_INVALID_RESPONSE, 0, twin_op_ctx->cb.reported_properties.context);
                                }
                            }
                            else
                            {
                                if (twin_op_ctx->cb.reported_properties.callback != NULL)
                                {
                                    twin_op_ctx->cb.reported_properties.callback(TWIN_REPORT_STATE_RESULT_SUCCESS, TWIN_REPORT_STATE_REASON_NONE, status_code, twin_op_ctx->cb.reported_properties.context);
                                }
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_GET)
                        {
                            if (!has_twin_report)
                            {
                                LogError("Received an incoming TWIN message for a GET operation, but with no report (%s, %s)", twin_msgr->device_id, correlation_id);

                                disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;

                                if (twin_op_ctx->msgr->on_message_received_callback != NULL)
                                {
                                    twin_op_ctx->msgr->on_message_received_callback(TWIN_UPDATE_TYPE_COMPLETE, NULL, 0, twin_op_ctx->msgr->on_message_received_context);
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES)
                                {
                                    twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES;
                                    twin_msgr->subscription_error_count++;
                                }
                            }
                            else
                            {
                                if (twin_op_ctx->msgr->on_message_received_callback != NULL)
                                {
                                    twin_op_ctx->msgr->on_message_received_callback(TWIN_UPDATE_TYPE_COMPLETE, (const char*)twin_report.bytes, twin_report.length, twin_op_ctx->msgr->on_message_received_context);
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES)
                                {
                                    twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_SUBSCRIBE_FOR_UPDATES;
                                    twin_msgr->subscription_error_count = 0;
                                }
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_GET_ON_DEMAND)
                        {
                            if (!has_twin_report)
                            {
                                LogError("Received an incoming TWIN message for a GET operation, but with no report (%s, %s)", twin_msgr->device_id, correlation_id);

                                disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;

                                twin_op_ctx->cb.get_twin.callback(TWIN_UPDATE_TYPE_COMPLETE, NULL, 0, twin_op_ctx->cb.get_twin.context);
                            }
                            else
                            {
                                twin_op_ctx->cb.get_twin.callback(TWIN_UPDATE_TYPE_COMPLETE, (const char*)twin_report.bytes, twin_report.length, twin_op_ctx->cb.get_twin.context);
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PUT)
                        {
                            if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_SUBSCRIBED)
                            {
                                bool subscription_succeeded = true;

                                if (!has_status_code)
                                {
                                    LogError("Received an incoming TWIN message for a PUT operation, but with no status code (%s, %s)", twin_msgr->device_id, correlation_id);

                                    subscription_succeeded = false;
                                }
                                else if (status_code < 200 || status_code >= 300)
                                {
                                    LogError("Received status code %d for TWIN subscription request (%s, %s)", status_code, twin_msgr->device_id, correlation_id);

                                    subscription_succeeded = false;
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_SUBSCRIBING)
                                {
                                    if (subscription_succeeded)
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_SUBSCRIBED;
                                        twin_msgr->subscription_error_count = 0;
                                    }
                                    else
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_SUBSCRIBE_FOR_UPDATES;
                                        twin_msgr->subscription_error_count++;
                                    }
                                }
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_DELETE)
                        {
                            if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED)
                            {
                                bool unsubscription_succeeded = true;

                                if (!has_status_code)
                                {
                                    LogError("Received an incoming TWIN message for a DELETE operation, but with no status code (%s, %s)", twin_msgr->device_id, correlation_id);

                                    unsubscription_succeeded = false;
                                }
                                else if (status_code < 200 || status_code >= 300)
                                {
                                    LogError("Received status code %d for TWIN unsubscription request (%s, %s)", status_code, twin_msgr->device_id, correlation_id);

                                    unsubscription_succeeded = false;
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBING)
                                {
                                    if (unsubscription_succeeded)
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED;
                                        twin_msgr->subscription_error_count = 0;
                                    }
                                    else
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBE;
                                        twin_msgr->subscription_error_count++;
                                    }
                                }
                            }
                        }

                        destroy_twin_operation_context(twin_op_ctx);
                    }

                    if (singlylinkedlist_remove(twin_msgr->operations, list_item) != 0)
                    {
                        LogError("Failed removing context for incoming TWIN message (%s, %s)",
                            twin_msgr->device_id, correlation_id);

                        update_state(twin_msgr, TWIN_MESSENGER_STATE_ERROR);
                    }
                }

                free(correlation_id);
            }
            else if (has_twin_report)
            {
                // It is supposed to be a desired properties delta update.

                if (twin_msgr->on_message_received_callback != NULL)
                {
                    twin_msgr->on_message_received_callback(TWIN_UPDATE_TYPE_PARTIAL, (const char*)twin_report.bytes, twin_report.length, twin_msgr->on_message_received_context);
                }
            }
            else
            {
                LogError("Received TWIN message with no correlation-id and no report (%s)", twin_msgr->device_id);
            }
        }
    }

    return disposition_result;
}